

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

double __thiscall
Trainer::Trainer<Kuhn::Game>::CFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *pdVar5;
  iterator iVar6;
  undefined8 uVar7;
  uint action;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  code *pcStack_110;
  double dStack_108;
  undefined1 local_100 [8];
  Game game_cp;
  string infoSet;
  void *local_60;
  double local_38;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  pcStack_110 = (code *)0x113023;
  bVar2 = Kuhn::Game::done(game);
  if (bVar2) {
    dVar10 = Kuhn::Game::payoff(game,playerIndex);
    return dVar10;
  }
  pcStack_110 = (code *)0x113047;
  actionNum = Kuhn::Game::actionNum(game);
  pcStack_110 = (code *)0x113052;
  bVar2 = Kuhn::Game::isChanceNode(game);
  if (bVar2) {
    if ((int)actionNum < 1) {
      local_38 = 0.0;
    }
    else {
      action = 0;
      local_38 = 0.0;
      do {
        pcStack_110 = (code *)0x113087;
        Kuhn::Game::Game((Game *)local_100,game);
        pcStack_110 = (code *)0x113092;
        Kuhn::Game::step((Game *)local_100,action);
        pcStack_110 = (code *)0x11309a;
        dVar10 = Kuhn::Game::chanceProbability((Game *)local_100);
        pcStack_110 = (code *)0x1130bb;
        dVar11 = CFR(this,(Game *)local_100,playerIndex,pi,dVar10 * po);
        local_38 = local_38 + dVar11 * dVar10;
        action = action + 1;
      } while (actionNum != action);
    }
  }
  else {
    pcStack_110 = (code *)0x1130ef;
    Kuhn::Game::infoSetStr_abi_cxx11_((string *)(game_cp.mInfoSets[1] + 9),game);
    pcStack_110 = (code *)0x1130f7;
    iVar3 = Kuhn::Game::currentPlayer(game);
    if (this->mUpdate[iVar3] == false) {
      if ((int)actionNum < 1) {
        local_38 = 0.0;
        uVar7 = &dStack_108;
      }
      else {
        local_38 = 0.0;
        uVar9 = 0;
        do {
          pcStack_110 = (code *)0x113262;
          Kuhn::Game::Game((Game *)local_100,game);
          pcStack_110 = (code *)0x11326d;
          Kuhn::Game::step((Game *)local_100,(int)uVar9);
          pcStack_110 = (code *)0x113284;
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this->mFixedStrategies[iVar3]._M_h,(key_type *)(game_cp.mInfoSets[1] + 9))
          ;
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            pcStack_110 = (code *)0x1133a1;
            uVar7 = std::__throw_out_of_range("_Map_base::at");
            pcStack_110 = (code *)0x1133b2;
            operator_delete(local_60,0x30);
            if ((size_type *)game_cp._88_8_ != &infoSet._M_string_length) {
              pcStack_110 = (code *)0x1133e6;
              operator_delete((void *)game_cp._88_8_,infoSet._M_string_length + 1);
            }
            pcStack_110 = chanceSamplingCFR;
            _Unwind_Resume(uVar7);
          }
          pcStack_110 = (code *)0x113296;
          pdVar5 = Node::averageStrategy
                             (*(Node **)((long)iVar6.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                               ._M_cur + 0x28));
          dVar10 = pdVar5[uVar9];
          pcStack_110 = (code *)0x1132b8;
          dVar11 = CFR(this,(Game *)local_100,playerIndex,pi,dVar10 * po);
          local_38 = local_38 + dVar10 * dVar11;
          uVar9 = uVar9 + 1;
          uVar7 = &dStack_108;
        } while (actionNum != uVar9);
      }
    }
    else {
      pcStack_110 = (code *)0x113124;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
      this_00 = *ppNVar4;
      if (this_00 == (mapped_type)0x0) {
        pcStack_110 = (code *)0x113136;
        this_00 = (mapped_type)operator_new(0x30);
        pcStack_110 = (code *)0x113145;
        Node::Node(this_00,actionNum);
        pcStack_110 = (code *)0x113155;
        ppNVar4 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
        *ppNVar4 = this_00;
      }
      pcStack_110 = (code *)0x113164;
      pdVar5 = Node::strategy(this_00);
      uVar9 = (ulong)actionNum;
      lVar1 = -(uVar9 * 8 + 0xf & 0xfffffffffffffff0);
      if ((int)actionNum < 1) {
        local_38 = 0.0;
        infoSet.field_2._8_8_ = &dStack_108;
      }
      else {
        local_38 = 0.0;
        uVar8 = 0;
        infoSet.field_2._8_8_ = &dStack_108;
        do {
          *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x1131bb;
          Kuhn::Game::Game((Game *)local_100,game);
          *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x1131c6;
          Kuhn::Game::step((Game *)local_100,(int)uVar8);
          if (iVar3 == playerIndex) {
            dVar10 = pdVar5[uVar8] * pi;
            dVar11 = po;
          }
          else {
            dVar10 = pi;
            dVar11 = pdVar5[uVar8] * po;
          }
          *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x1131fc;
          dVar10 = CFR(this,(Game *)local_100,playerIndex,dVar10,dVar11);
          *(double *)((long)&dStack_108 + uVar8 * 8 + lVar1 + -0x108 + 0x108) = dVar10;
          local_38 = local_38 + dVar10 * pdVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      uVar7 = infoSet.field_2._8_8_;
      if (iVar3 == playerIndex) {
        if (0 < (int)actionNum) {
          uVar8 = 0;
          do {
            dVar10 = *(double *)((long)&dStack_108 + uVar8 * 8 + lVar1 + -0x108 + 0x108);
            *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x113323;
            dVar11 = Node::regretSum(this_00,(int)uVar8);
            *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x113344;
            Node::regretSum(this_00,(int)uVar8,(dVar10 - local_38) * po + dVar11);
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        *(undefined8 *)((long)&pcStack_110 + lVar1) = 0x11335e;
        Node::strategySum(this_00,pdVar5,pi);
        uVar7 = infoSet.field_2._8_8_;
      }
    }
    if ((size_type *)game_cp._88_8_ != &infoSet._M_string_length) {
      *(undefined8 *)(uVar7 + -8) = 0x113381;
      operator_delete((void *)game_cp._88_8_,infoSet._M_string_length + 1);
    }
  }
  return local_38;
}

Assistant:

double Trainer<T>::CFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // chance node turn
    const int actionNum = game.actionNum();
    if (game.isChanceNode()) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const double chanceProbability = game_cp.chanceProbability();
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const auto chanceProbability = double(mFixedStrategies[player].at(infoSet)->averageStrategy()[a]);
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call CFR with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = CFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = CFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}